

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

void __thiscall Selector::fillPollFds(Selector *this,pollfd *fds,int *numFds)

{
  Node *pNVar1;
  ListenerNode *pLVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  AutoLock m;
  
  AutoLock::AutoLock(&m,&this->mLock);
  fds->fd = this->mPipe[0];
  fds->events = 1;
  pNVar4 = (this->mList).mHead;
  pNVar1 = (this->mList).mTail;
  iVar5 = 1;
  do {
    lVar6 = (long)iVar5;
    pNVar3 = pNVar4->next;
    do {
      pNVar4 = pNVar3;
      lVar7 = 1;
      if (pNVar4 == pNVar1) {
LAB_0011e10d:
        *numFds = iVar5;
        AutoLock::~AutoLock(&m);
        return;
      }
      for (; lVar7 < lVar6; lVar7 = lVar7 + 1) {
        if (fds[lVar7].fd == pNVar4->val->mFd) {
          fds[lVar7].events = fds[lVar7].events & pNVar4->val->mEvents;
          break;
        }
      }
      if (iVar5 == (int)lVar7) {
        pLVar2 = pNVar4->val;
        fds[lVar6].fd = pLVar2->mFd;
        fds[lVar6].events = pLVar2->mEvents;
        iVar5 = iVar5 + 1;
        if (iVar5 == 0x40) {
          iVar5 = 0x40;
          goto LAB_0011e10d;
        }
        break;
      }
      pNVar3 = (Node *)0x0;
    } while (pNVar4 == (Node *)0x0);
  } while( true );
}

Assistant:

void Selector::fillPollFds( struct pollfd *fds, int &numFds )
{
	AutoLock m( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );

	fds[ 0 ].fd = mPipe[ PIPE_READER ];
	fds[ 0 ].events = POLLIN;

	int j, i = 1;

	for (JetHead::list<ListenerNode*>::iterator listener = mList.begin(); 
		 listener != mList.end(); ++listener)
	{
		// If we already have this fd in our list, skip it
		for ( j = 1; j < i; j++ )
		{
			if ( fds[ j ].fd == (*listener)->mFd )
			{
				fds[ j ].events &= (*listener)->mEvents;
				break;
			}
		}
		
		if ( j == i )
		{
			fds[ i ].fd = (*listener)->mFd;
			fds[ i ].events = (*listener)->mEvents;
			i++;

			if ( i == kMaxPollFds )
			{
				numFds = kMaxPollFds;
				return;
			}
		}
	}
	
	numFds = i;
	
	for ( i = 0; i < numFds; i++ )
	{
		LOG_NOISE( "file entry %d: fd %d events %x", i, fds[ i ].fd, fds[ i ].events );
	}
	
	LOG( "poll on %d fds, size %d", numFds, mList.size() );
}